

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O0

bool __thiscall
xray_re::xr_file_system::copy_file(xr_file_system *this,char *src_path,char *tgt_path)

{
  bool bVar1;
  undefined1 local_78 [8];
  CPath to;
  CPath from;
  char *tgt_path_local;
  char *src_path_local;
  xr_file_system *this_local;
  
  bVar1 = read_only(this);
  if (bVar1) {
    dbg("fs_ro: copying %s to %s",src_path,tgt_path);
    this_local._7_1_ = true;
  }
  else {
    CPath::CPath((CPath *)&to.super_path._M_cmpts,src_path);
    CPath::CPath((CPath *)local_78,tgt_path);
    CPath::make_preferred_abi_cxx11_((CPath *)&to.super_path._M_cmpts);
    CPath::make_preferred_abi_cxx11_((CPath *)local_78);
    this_local._7_1_ = std::filesystem::copy_file((path *)&to.super_path._M_cmpts,(path *)local_78);
    CPath::~CPath((CPath *)local_78);
    CPath::~CPath((CPath *)&to.super_path._M_cmpts);
  }
  return this_local._7_1_;
}

Assistant:

bool xr_file_system::copy_file(const char* src_path, const char* tgt_path) const
{
	if(read_only())
	{
		dbg("fs_ro: copying %s to %s", src_path, tgt_path);

		return true;
	}
	else
	{
		CPath from(src_path), to(tgt_path);

		from.make_preferred();
		to.make_preferred();

		return fs::copy_file(from, to);
	}
}